

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

GuardBuilder * __thiscall
r_exec::CTPX::get_default_guard_builder(CTPX *this,_Fact *cause,_Fact *consequent,uint64_t period)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  NoArgCmdGuardBuilder *this_00;
  
  iVar2 = (*(cause->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(cause,0);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
            ((long *)CONCAT44(extraout_var,iVar2),0);
  sVar1 = r_code::Atom::asOpcode();
  if (sVar1 == Opcodes::Cmd) {
    uVar3 = _Fact::get_after(consequent);
    uVar4 = _Fact::get_after(cause);
    uVar5 = _Fact::get_before(cause);
    uVar6 = _Fact::get_after(cause);
    this_00 = (NoArgCmdGuardBuilder *)operator_new(0x28);
    NoArgCmdGuardBuilder::NoArgCmdGuardBuilder(this_00,period,uVar3 - uVar4,uVar5 - uVar6);
  }
  else {
    this_00 = (NoArgCmdGuardBuilder *)operator_new(0x18);
    TimingGuardBuilder::TimingGuardBuilder((TimingGuardBuilder *)this_00,period);
  }
  return (GuardBuilder *)this_00;
}

Assistant:

GuardBuilder *CTPX::get_default_guard_builder(_Fact *cause, _Fact *consequent, uint64_t period)
{
    Code *cause_payload = cause->get_reference(0);
    uint16_t opcode = cause_payload->code(0).asOpcode();

    if (opcode == Opcodes::Cmd) {
        uint64_t offset = consequent->get_after() - cause->get_after();
        uint64_t cmd_duration = cause->get_before() - cause->get_after();
        return new NoArgCmdGuardBuilder(period, offset, cmd_duration);
    }

    return new TimingGuardBuilder(period);
}